

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.h
# Opt level: O3

void __thiscall LEFReader::~LEFReader(LEFReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_LEFReader = (_func_int **)&PTR__LEFReader_001422f8;
  pcVar2 = (this->m_tokstr)._M_dataplus._M_p;
  paVar1 = &(this->m_tokstr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~LEFReader() {}